

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_misc.cpp
# Opt level: O1

void Am_Draw_Rect_Border(am_rect r,Am_Style *upper_left,Am_Style *lower_right,Am_Drawonable *draw)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = r._0_8_;
  uVar4 = uVar1 >> 0x20;
  uVar2 = (ulong)((r.left + r.width) - 1);
  uVar3 = (ulong)((r.top + r.height) - 1);
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,upper_left,&Am_No_Style,uVar1 & 0xffffffff,(ulong)((r.top + r.height) - 2),
             uVar1 & 0xffffffff,uVar4,(ulong)((r.left + r.width) - 2),uVar4,0);
  (*draw->_vptr_Am_Drawonable[0x2a])
            (draw,lower_right,&Am_No_Style,uVar1 & 0xffffffff,uVar3,uVar2,uVar3,uVar2,uVar4,0);
  return;
}

Assistant:

void
Am_Draw_Rect_Border(am_rect r, Am_Style upper_left, Am_Style lower_right,
                    Am_Drawonable *draw)
{
  r.width -= 1;
  r.height -= 1;
  draw->Draw_2_Lines(upper_left, Am_No_Style, r.left, r.top + r.height - 1,
                     r.left, r.top, r.left + r.width - 1, r.top);
  draw->Draw_2_Lines(lower_right, Am_No_Style, r.left, r.top + r.height,
                     r.left + r.width, r.top + r.height, r.left + r.width,
                     r.top);
}